

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O1

void __thiscall
Lib::
Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
::~Recycled(Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
            *this)

{
  _Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator_*,_false>
  _Var1;
  uint *puVar2;
  FastInstancesIterator *in_RAX;
  Stack<std::unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator>_>_>
  *this_00;
  _Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator_*,_false>
  local_18;
  
  _Var1._M_head_impl =
       (this->_self)._M_t.
       super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator>_>
       ._M_t.
       super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator>_>
       .
       super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator_*,_false>
       ._M_head_impl;
  local_18._M_head_impl = in_RAX;
  if ((_Var1._M_head_impl != (FastInstancesIterator *)0x0) &&
     (((((_Var1._M_head_impl)->_specVarNumbers)._capacity != 0 ||
        ((_Var1._M_head_impl)->_alternatives)._capacity != 0 ||
       (((_Var1._M_head_impl)->_nodeTypes)._capacity != 0)) &&
      (Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator,Lib::DefaultReset,Lib::DefaultKeepRecycled>
       ::memAlive == '\x01')))) {
    puVar2 = *(uint **)((long)&(_Var1._M_head_impl)->_specVarNumbers + 8);
    *(void ***)((long)&(_Var1._M_head_impl)->_alternatives + 0x10) =
         *(void ***)((long)&(_Var1._M_head_impl)->_alternatives + 8);
    *(uint **)((long)&(_Var1._M_head_impl)->_specVarNumbers + 0x10) = puVar2;
    *(NodeAlgorithm **)((long)&(_Var1._M_head_impl)->_nodeTypes + 0x10) =
         *(NodeAlgorithm **)((long)&(_Var1._M_head_impl)->_nodeTypes + 8);
    this_00 = mem();
    local_18._M_head_impl =
         (this->_self)._M_t.
         super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator>_>
         ._M_t.
         super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator>_>
         .
         super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator_*,_false>
         ._M_head_impl;
    (this->_self)._M_t.
    super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator>_>
    ._M_t.
    super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator>_>
    .
    super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator_*,_false>
    ._M_head_impl = (FastInstancesIterator *)0x0;
    if (this_00->_cursor == this_00->_end) {
      Stack<std::unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator>_>_>
      ::expand(this_00);
    }
    (this_00->_cursor->_M_t).
    super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator>_>
    ._M_t.
    super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator>_>
    .
    super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator_*,_false>
    ._M_head_impl = local_18._M_head_impl;
    local_18._M_head_impl = (FastInstancesIterator *)0x0;
    this_00->_cursor = this_00->_cursor + 1;
    std::
    unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator>_>
    ::~unique_ptr((unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator>_>
                   *)&local_18);
  }
  std::
  unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator>_>
  ::~unique_ptr(&this->_self);
  return;
}

Assistant:

~Recycled()
  {
    if (IF_USE_PTRS(_self, true) && _keep(self()) && memAlive) {
      _reset(self());
      mem().push(std::move(_self));
    }
  }